

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void __thiscall
jaegertracing::agent::thrift::AgentConcurrentClient::send_emitZipkinBatch
          (AgentConcurrentClient *this,
          vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
          *spans)

{
  TProtocol *pTVar1;
  size_t __n;
  void *__buf;
  __shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_58;
  TConcurrentSendSentry sentry;
  Agent_emitZipkinBatch_pargs args;
  
  apache::thrift::async::TConcurrentSendSentry::TConcurrentSendSentry(&sentry,&this->sync_);
  pTVar1 = this->oprot_;
  std::__cxx11::string::string((string *)&args,"emitZipkinBatch",(allocator *)&local_58);
  __n = 0;
  (*pTVar1->_vptr_TProtocol[2])(pTVar1,&args,4);
  std::__cxx11::string::~string((string *)&args);
  args._vptr_Agent_emitZipkinBatch_pargs = (_func_int **)&PTR__Agent_emitZipkinBatch_pargs_002995c8;
  args.spans = spans;
  Agent_emitZipkinBatch_pargs::write(&args,(int)this->oprot_,__buf,__n);
  (*this->oprot_->_vptr_TProtocol[3])();
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(this->oprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(local_58._M_ptr)->_vptr_TTransport[10])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(this->oprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(local_58._M_ptr)->_vptr_TTransport[0xb])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  apache::thrift::async::TConcurrentSendSentry::commit(&sentry);
  Agent_emitZipkinBatch_pargs::~Agent_emitZipkinBatch_pargs(&args);
  apache::thrift::async::TConcurrentSendSentry::~TConcurrentSendSentry(&sentry);
  return;
}

Assistant:

void AgentConcurrentClient::send_emitZipkinBatch(const std::vector< ::twitter::zipkin::thrift::Span> & spans)
{
  int32_t cseqid = 0;
  ::apache::thrift::async::TConcurrentSendSentry sentry(&this->sync_);
  oprot_->writeMessageBegin("emitZipkinBatch", ::apache::thrift::protocol::T_ONEWAY, cseqid);

  Agent_emitZipkinBatch_pargs args;
  args.spans = &spans;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();

  sentry.commit();
}